

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O1

void __thiscall SleighBuilder::delaySlot(SleighBuilder *this,OpTpl *op)

{
  int iVar1;
  int iVar2;
  ParserWalker *pPVar3;
  uintb uVar4;
  AddrSpace *pAVar5;
  uintb uVar6;
  ParserContext *pPVar7;
  LowlevelError *this_00;
  ParserContext *pPVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int4 iVar12;
  Address newaddr;
  ParserWalker newwalker;
  Address local_e0;
  undefined1 local_d0 [160];
  
  pPVar3 = (this->super_PcodeBuilder).walker;
  uVar4 = this->uniqueoffset;
  pPVar7 = pPVar3->const_context;
  pPVar8 = pPVar3->cross_context;
  if (pPVar3->cross_context == (ParserContext *)0x0) {
    pPVar8 = pPVar7;
  }
  pAVar5 = (pPVar8->addr).base;
  uVar6 = (pPVar8->addr).offset;
  iVar12 = pPVar7->base_state->length;
  iVar1 = pPVar7->delayslot;
  iVar11 = 0;
  while( true ) {
    local_e0.offset = (long)iVar12 + uVar6;
    uVar9 = pAVar5->highest;
    if (uVar9 < local_e0.offset) {
      uVar9 = uVar9 + 1;
      lVar10 = (long)local_e0.offset % (long)uVar9;
      local_e0.offset = (lVar10 >> 0x3f & uVar9) + lVar10;
    }
    this->uniqueoffset = (local_e0.offset & this->uniquemask) << 4;
    local_e0.base = pAVar5;
    pPVar7 = DisassemblyCache::getParserContext(this->discache,&local_e0);
    if (pPVar7->parsestate != 2) break;
    iVar2 = pPVar7->base_state->length;
    local_d0._8_8_ = (ParserContext *)0x0;
    (this->super_PcodeBuilder).walker = (ParserWalker *)local_d0;
    local_d0._16_8_ = pPVar7->base_state;
    local_d0._24_4_ = 0;
    local_d0._28_4_ = 0;
    local_d0._0_8_ = pPVar7;
    PcodeBuilder::build(&this->super_PcodeBuilder,((ConstructState *)local_d0._16_8_)->ct->templ,-1)
    ;
    iVar12 = iVar12 + iVar2;
    iVar11 = iVar11 + iVar2;
    if (iVar1 <= iVar11) {
      (this->super_PcodeBuilder).walker = pPVar3;
      this->uniqueoffset = uVar4;
      return;
    }
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"Could not obtain cached delay slot instruction","");
  LowlevelError::LowlevelError(this_00,(string *)local_d0);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void SleighBuilder::delaySlot(OpTpl *op)

{				// Append pcode for an entire instruction (delay slot)
				// in the middle of the current instruction
  ParserWalker *tmp = walker;
  uintb olduniqueoffset = uniqueoffset;

  Address baseaddr = tmp->getAddr();
  int4 fallOffset = tmp->getLength();
  int4 delaySlotByteCnt = tmp->getParserContext()->getDelaySlot();
  int4 bytecount = 0;
  do {
    Address newaddr = baseaddr + fallOffset;
    setUniqueOffset(newaddr);
    const ParserContext *pos = discache->getParserContext(newaddr);
    if (pos->getParserState() != ParserContext::pcode)
      throw LowlevelError("Could not obtain cached delay slot instruction");
    int4 len = pos->getLength();

    ParserWalker newwalker( pos );
    walker = &newwalker;
    walker->baseState();
    build(walker->getConstructor()->getTempl(),-1); // Build the whole delay slot
    fallOffset += len;
    bytecount += len;
  } while(bytecount < delaySlotByteCnt);
  walker = tmp;			// Restore original context
  uniqueoffset = olduniqueoffset;
}